

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::compute_order::compute_order
          (compute_order *this,constraint_order order_,int variable_number)

{
  size_type __n;
  constraint_order local_74;
  allocator<std::pair<int,_int>_> local_2d [20];
  allocator<int> local_19;
  int local_18;
  constraint_order local_14;
  int variable_number_local;
  constraint_order order__local;
  compute_order *this_local;
  
  local_18 = variable_number;
  local_14 = order_;
  _variable_number_local = this;
  std::allocator<int>::allocator(&local_19);
  std::vector<int,_std::allocator<int>_>::vector(&this->R,(long)variable_number,&local_19);
  std::allocator<int>::~allocator(&local_19);
  __n = (size_type)local_18;
  std::allocator<std::pair<int,_int>_>::allocator(local_2d);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            (&this->m_order,__n,local_2d);
  std::allocator<std::pair<int,_int>_>::~allocator(local_2d);
  if (local_14 == cycle) {
    local_74 = none;
  }
  else {
    local_74 = local_14;
  }
  this->order = local_74;
  this->use_cycle = local_14 == cycle;
  return;
}

Assistant:

compute_order(const solver_parameters::constraint_order order_,
                  const int variable_number)
      : R(static_cast<std::vector<int>::size_type>(variable_number))
      , m_order(static_cast<std::vector<int>::size_type>(variable_number))
      , order(order_ == solver_parameters::constraint_order::cycle
                ? solver_parameters::constraint_order::none
                : order_)
      , use_cycle(order_ == solver_parameters::constraint_order::cycle)
    {}